

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

LRUHandle * __thiscall leveldb::anon_unknown_0::HandleTable::Insert(HandleTable *this,LRUHandle *h)

{
  LRUHandle *pLVar1;
  LRUHandle *local_48;
  LRUHandle *old;
  LRUHandle **local_20;
  LRUHandle **ptr;
  LRUHandle *h_local;
  HandleTable *this_local;
  
  ptr = (LRUHandle **)h;
  h_local = (LRUHandle *)this;
  _old = LRUHandle::key(h);
  local_20 = FindPointer(this,(Slice *)&old,*(uint32_t *)(ptr + 8));
  pLVar1 = *local_20;
  if (pLVar1 == (LRUHandle *)0x0) {
    local_48 = (LRUHandle *)0x0;
  }
  else {
    local_48 = pLVar1->next_hash;
  }
  ptr[2] = local_48;
  *local_20 = (LRUHandle *)ptr;
  if ((pLVar1 == (LRUHandle *)0x0) &&
     (this->elems_ = this->elems_ + 1, this->length_ < this->elems_)) {
    Resize(this);
  }
  return pLVar1;
}

Assistant:

LRUHandle* Insert(LRUHandle* h) {
    LRUHandle** ptr = FindPointer(h->key(), h->hash);
    LRUHandle* old = *ptr;
    h->next_hash = (old == nullptr ? nullptr : old->next_hash);
    *ptr = h;
    if (old == nullptr) {
      ++elems_;
      if (elems_ > length_) {
        // Since each cache entry is fairly large, we aim for a small
        // average linked list length (<= 1).
        Resize();
      }
    }
    return old;
  }